

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O1

MultiIndexSet * __thiscall
TasGrid::GridLocalPolynomial::getRefinementCanidates<(TasGrid::RuleLocal::erule)4>
          (MultiIndexSet *__return_storage_ptr__,GridLocalPolynomial *this,double tolerance,
          TypeRefinement criteria,int output,vector<int,_std::allocator<int>_> *level_limits,
          double *scale_correction)

{
  MultiIndexSet *exclude;
  uint uVar1;
  pointer piVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  MultiIndexSet *result;
  Data2D<int> pmap;
  long local_a8;
  long local_90;
  Data2D<int> local_80;
  Data2D<int> local_58;
  
  buildUpdateMap<(TasGrid::RuleLocal::erule)4>
            (&local_58,this,tolerance,criteria,output,scale_correction);
  local_80.stride = (size_t)(this->super_BaseCanonicalGrid).num_dimensions;
  exclude = &(this->super_BaseCanonicalGrid).points;
  local_80.num_strips = 0;
  local_80.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_80.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_80.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar1 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  if ((level_limits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start ==
      (level_limits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    if (0 < (int)uVar1) {
      local_a8 = 0;
      uVar6 = 0;
      do {
        piVar2 = local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (0 < (this->super_BaseCanonicalGrid).num_dimensions) {
          lVar5 = local_58.stride * local_a8;
          lVar4 = 0;
          do {
            if ((*(int *)((long)piVar2 + lVar4 * 4 + lVar5) == 1) &&
               (((criteria & ~refine_direction_selective) != refine_parents_first ||
                (bVar3 = addParent<(TasGrid::RuleLocal::erule)4>
                                   (this,(this->super_BaseCanonicalGrid).points.indexes.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start +
                                         (this->super_BaseCanonicalGrid).points.num_dimensions *
                                         uVar6,(int)lVar4,exclude,&local_80), !bVar3)))) {
              addChild<(TasGrid::RuleLocal::erule)4>
                        (this,(this->super_BaseCanonicalGrid).points.indexes.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start +
                              (this->super_BaseCanonicalGrid).points.num_dimensions * uVar6,
                         (int)lVar4,exclude,&local_80);
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 < (this->super_BaseCanonicalGrid).num_dimensions);
        }
        uVar6 = uVar6 + 1;
        local_a8 = local_a8 + 4;
      } while (uVar6 != uVar1);
    }
  }
  else if (0 < (int)uVar1) {
    local_90 = 0;
    uVar6 = 0;
    do {
      piVar2 = local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (0 < (this->super_BaseCanonicalGrid).num_dimensions) {
        lVar5 = local_58.stride * local_90;
        lVar4 = 0;
        do {
          if ((*(int *)((long)piVar2 + lVar4 * 4 + lVar5) == 1) &&
             (((criteria & ~refine_direction_selective) != refine_parents_first ||
              (bVar3 = addParent<(TasGrid::RuleLocal::erule)4>
                                 (this,(this->super_BaseCanonicalGrid).points.indexes.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start +
                                       (this->super_BaseCanonicalGrid).points.num_dimensions * uVar6
                                  ,(int)lVar4,exclude,&local_80), !bVar3)))) {
            addChildLimited<(TasGrid::RuleLocal::erule)4>
                      (this,(this->super_BaseCanonicalGrid).points.indexes.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start +
                            (this->super_BaseCanonicalGrid).points.num_dimensions * uVar6,(int)lVar4
                       ,exclude,level_limits,&local_80);
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < (this->super_BaseCanonicalGrid).num_dimensions);
      }
      uVar6 = uVar6 + 1;
      local_90 = local_90 + 4;
    } while (uVar6 != uVar1);
  }
  MultiIndexSet::MultiIndexSet(__return_storage_ptr__,&local_80);
  if (criteria == refine_stable) {
    HierarchyManipulations::completeToLower<(TasGrid::RuleLocal::erule)4>
              (exclude,__return_storage_ptr__);
  }
  if (local_80.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

MultiIndexSet GridLocalPolynomial::getRefinementCanidates(double tolerance, TypeRefinement criteria, int output, const std::vector<int> &level_limits, const double *scale_correction) const{
    Data2D<int> pmap = buildUpdateMap<effrule>(tolerance, criteria, output, scale_correction);

    bool useParents = (criteria == refine_fds) || (criteria == refine_parents_first);

    Data2D<int> refined(num_dimensions, 0);

    int num_points = points.getNumIndexes();

    #ifdef _OPENMP
    #pragma omp parallel
    {
        Data2D<int> lrefined(num_dimensions, 0);

        if (level_limits.empty()){
            #pragma omp for
            for(int i=0; i<num_points; i++){
                const int *map = pmap.getStrip(i);
                for(int j=0; j<num_dimensions; j++){
                    if (map[j] == 1){ // if this dimension needs to be refined
                        if (!(useParents && addParent<effrule>(points.getIndex(i), j, points, lrefined))){
                            addChild<effrule>(points.getIndex(i), j, points, lrefined);
                        }
                    }
                }
            }
        }else{
            #pragma omp for
            for(int i=0; i<num_points; i++){
                const int *map = pmap.getStrip(i);
                for(int j=0; j<num_dimensions; j++){
                    if (map[j] == 1){ // if this dimension needs to be refined
                        if (!(useParents && addParent<effrule>(points.getIndex(i), j, points, lrefined))){
                            addChildLimited<effrule>(points.getIndex(i), j, points, level_limits, lrefined);
                        }
                    }
                }
            }
        }

        #pragma omp critical
        {
            refined.append(lrefined);
        }
    }
    #else
    if (level_limits.empty()){
        for(int i=0; i<num_points; i++){
            const int *map = pmap.getStrip(i);
            for(int j=0; j<num_dimensions; j++){
                if (map[j] == 1){ // if this dimension needs to be refined
                    if (!(useParents && addParent<effrule>(points.getIndex(i), j, points, refined))){
                        addChild<effrule>(points.getIndex(i), j, points, refined);
                    }
                }
            }
        }
    }else{
        for(int i=0; i<num_points; i++){
            const int *map = pmap.getStrip(i);
            for(int j=0; j<num_dimensions; j++){
                if (map[j] == 1){ // if this dimension needs to be refined
                    if (!(useParents && addParent<effrule>(points.getIndex(i), j, points, refined))){
                        addChildLimited<effrule>(points.getIndex(i), j, points, level_limits, refined);
                    }
                }
            }
        }
    }
    #endif

    MultiIndexSet result(refined);
    if (criteria == refine_stable)
        HierarchyManipulations::completeToLower<effrule>(points, result);

    return result;
}